

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

Filter * __thiscall
helics::make_filter(helics *this,FilterTypes type,Federate *mFed,string_view name)

{
  Filter *filt;
  char *pcVar1;
  Core *extraout_RDX;
  Core *extraout_RDX_00;
  undefined4 in_register_00000034;
  string_view filterName;
  string_view filterName_00;
  
  pcVar1 = (char *)name._M_len;
  if ((FilterTypes)this == CLONE) {
    filterName._M_str = pcVar1;
    filterName._M_len = (size_t)mFed;
    filt = &Federate::registerCloningFilter
                      ((Federate *)CONCAT44(in_register_00000034,type),filterName,
                       (string_view)ZEXT816(0),(string_view)ZEXT816(0))->super_Filter;
    addOperations(filt,CLONE,extraout_RDX);
    (*(filt->super_Interface)._vptr_Interface[6])(filt,8,"delivery",mFed,pcVar1);
  }
  else {
    filterName_00._M_str = pcVar1;
    filterName_00._M_len = (size_t)mFed;
    filt = Federate::registerFilter
                     ((Federate *)CONCAT44(in_register_00000034,type),filterName_00,
                      (string_view)ZEXT816(0),(string_view)ZEXT816(0));
    addOperations(filt,(FilterTypes)this,extraout_RDX_00);
  }
  return filt;
}

Assistant:

Filter& make_filter(FilterTypes type, Federate* mFed, std::string_view name)
{
    if (type == FilterTypes::CLONE) {
        Filter& dfilt = mFed->registerCloningFilter(name);
        addOperations(&dfilt, type, mFed->getCorePointer().get());
        dfilt.setString("delivery", name);
        return dfilt;
    }
    auto& dfilt = mFed->registerFilter(name);
    addOperations(&dfilt, type, nullptr);
    return dfilt;
}